

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O1

tokenType icu_63::PluralRuleParser::getKeyType(UnicodeString *token,tokenType keyType)

{
  short sVar1;
  int8_t iVar2;
  int32_t iVar3;
  ConstChar16Ptr local_128;
  ConstChar16Ptr local_120;
  ConstChar16Ptr local_118;
  ConstChar16Ptr local_110;
  ConstChar16Ptr local_108;
  ConstChar16Ptr local_100;
  ConstChar16Ptr local_f8 [3];
  char16_t *local_e0;
  char16_t *local_d0;
  char16_t *local_c0;
  char16_t *local_b0;
  char16_t *local_a0;
  char16_t *local_90;
  undefined8 *local_80;
  undefined6 *local_70;
  undefined4 *local_60;
  undefined4 *local_50;
  undefined4 *local_40;
  undefined4 *local_30;
  undefined4 *local_20;
  
  if (keyType == tKeyword) {
    sVar1 = (token->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar3 = (token->fUnion).fFields.fLength;
    }
    else {
      iVar3 = (int)sVar1 >> 5;
    }
    iVar2 = UnicodeString::doCompare(token,0,iVar3,L"n",0,1);
    local_20 = &PK_VAR_N;
    if (iVar2 == '\0') {
      keyType = tVariableN;
    }
    else {
      sVar1 = (token->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar3 = (token->fUnion).fFields.fLength;
      }
      else {
        iVar3 = (int)sVar1 >> 5;
      }
      iVar2 = UnicodeString::doCompare(token,0,iVar3,L"i",0,1);
      local_30 = &PK_VAR_I;
      if (iVar2 == '\0') {
        keyType = tVariableI;
      }
      else {
        sVar1 = (token->fUnion).fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          iVar3 = (token->fUnion).fFields.fLength;
        }
        else {
          iVar3 = (int)sVar1 >> 5;
        }
        iVar2 = UnicodeString::doCompare(token,0,iVar3,L"f",0,1);
        local_40 = &PK_VAR_F;
        if (iVar2 == '\0') {
          keyType = tVariableF;
        }
        else {
          sVar1 = (token->fUnion).fStackFields.fLengthAndFlags;
          if (sVar1 < 0) {
            iVar3 = (token->fUnion).fFields.fLength;
          }
          else {
            iVar3 = (int)sVar1 >> 5;
          }
          iVar2 = UnicodeString::doCompare(token,0,iVar3,L"t",0,1);
          local_50 = &PK_VAR_T;
          if (iVar2 == '\0') {
            keyType = tVariableT;
          }
          else {
            sVar1 = (token->fUnion).fStackFields.fLengthAndFlags;
            if (sVar1 < 0) {
              iVar3 = (token->fUnion).fFields.fLength;
            }
            else {
              iVar3 = (int)sVar1 >> 5;
            }
            iVar2 = UnicodeString::doCompare(token,0,iVar3,L"v",0,1);
            local_60 = &PK_VAR_V;
            if (iVar2 == '\0') {
              keyType = tVariableV;
            }
            else {
              sVar1 = (token->fUnion).fStackFields.fLengthAndFlags;
              if (sVar1 < 0) {
                iVar3 = (token->fUnion).fFields.fLength;
              }
              else {
                iVar3 = (int)sVar1 >> 5;
              }
              iVar2 = UnicodeString::doCompare(token,0,iVar3,L"is",0,2);
              local_70 = &PK_IS;
              if (iVar2 == '\0') {
                keyType = tIs;
              }
              else {
                sVar1 = (token->fUnion).fStackFields.fLengthAndFlags;
                if (sVar1 < 0) {
                  iVar3 = (token->fUnion).fFields.fLength;
                }
                else {
                  iVar3 = (int)sVar1 >> 5;
                }
                iVar2 = UnicodeString::doCompare(token,0,iVar3,L"and",0,3);
                local_80 = &PK_AND;
                if (iVar2 == '\0') {
                  keyType = tAnd;
                }
                else {
                  local_f8[0].p_ = L"in";
                  iVar2 = UnicodeString::compare(token,local_f8,2);
                  local_90 = local_f8[0].p_;
                  if (iVar2 == '\0') {
                    keyType = tIn;
                  }
                  else {
                    local_100.p_ = (char16_t *)PK_WITHIN;
                    iVar2 = UnicodeString::compare(token,&local_100,6);
                    local_a0 = local_100.p_;
                    if (iVar2 == '\0') {
                      keyType = tWithin;
                    }
                    else {
                      local_108.p_ = L"not";
                      iVar2 = UnicodeString::compare(token,&local_108,3);
                      local_b0 = local_108.p_;
                      if (iVar2 == '\0') {
                        keyType = tNot;
                      }
                      else {
                        local_110.p_ = L"mod";
                        iVar2 = UnicodeString::compare(token,&local_110,3);
                        local_c0 = local_110.p_;
                        if (iVar2 == '\0') {
                          keyType = tMod;
                        }
                        else {
                          local_118.p_ = L"or";
                          iVar2 = UnicodeString::compare(token,&local_118,2);
                          local_d0 = local_118.p_;
                          if (iVar2 == '\0') {
                            keyType = tOr;
                          }
                          else {
                            local_120.p_ = (char16_t *)PK_DECIMAL;
                            iVar2 = UnicodeString::compare(token,&local_120,7);
                            local_e0 = local_120.p_;
                            if (iVar2 == '\0') {
                              keyType = tDecimal;
                            }
                            else {
                              local_128.p_ = (char16_t *)PK_INTEGER;
                              iVar2 = UnicodeString::compare(token,&local_128,7);
                              keyType = tKeyword;
                              if (iVar2 == '\0') {
                                keyType = tInteger;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return keyType;
}

Assistant:

tokenType
PluralRuleParser::getKeyType(const UnicodeString &token, tokenType keyType)
{
    if (keyType != tKeyword) {
        return keyType;
    }

    if (0 == token.compare(PK_VAR_N, 1)) {
        keyType = tVariableN;
    } else if (0 == token.compare(PK_VAR_I, 1)) {
        keyType = tVariableI;
    } else if (0 == token.compare(PK_VAR_F, 1)) {
        keyType = tVariableF;
    } else if (0 == token.compare(PK_VAR_T, 1)) {
        keyType = tVariableT;
    } else if (0 == token.compare(PK_VAR_V, 1)) {
        keyType = tVariableV;
    } else if (0 == token.compare(PK_IS, 2)) {
        keyType = tIs;
    } else if (0 == token.compare(PK_AND, 3)) {
        keyType = tAnd;
    } else if (0 == token.compare(PK_IN, 2)) {
        keyType = tIn;
    } else if (0 == token.compare(PK_WITHIN, 6)) {
        keyType = tWithin;
    } else if (0 == token.compare(PK_NOT, 3)) {
        keyType = tNot;
    } else if (0 == token.compare(PK_MOD, 3)) {
        keyType = tMod;
    } else if (0 == token.compare(PK_OR, 2)) {
        keyType = tOr;
    } else if (0 == token.compare(PK_DECIMAL, 7)) {
        keyType = tDecimal;
    } else if (0 == token.compare(PK_INTEGER, 7)) {
        keyType = tInteger;
    }
    return keyType;
}